

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

int llex(LexState *ls,SemInfo *seminfo)

{
  byte *pbVar1;
  int iVar2;
  size_t sVar3;
  TString *pTVar4;
  bool bVar5;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_54;
  uint local_50;
  uint local_4c;
  int c;
  TString *ts;
  size_t sep_1;
  size_t sep;
  SemInfo *seminfo_local;
  LexState *ls_local;
  
  ls->buff->n = 0;
  do {
    switch(ls->current) {
    default:
      if ((""[ls->current + 1] & 1) == 0) {
        iVar2 = ls->current;
        sVar3 = ls->z->n;
        ls->z->n = sVar3 - 1;
        if (sVar3 == 0) {
          local_80 = luaZ_fill(ls->z);
        }
        else {
          pbVar1 = (byte *)ls->z->p;
          ls->z->p = (char *)(pbVar1 + 1);
          local_80 = (uint)*pbVar1;
        }
        ls->current = local_80;
        return iVar2;
      }
      do {
        save(ls,ls->current);
        sVar3 = ls->z->n;
        ls->z->n = sVar3 - 1;
        if (sVar3 == 0) {
          local_7c = luaZ_fill(ls->z);
        }
        else {
          pbVar1 = (byte *)ls->z->p;
          ls->z->p = (char *)(pbVar1 + 1);
          local_7c = (uint)*pbVar1;
        }
        ls->current = local_7c;
      } while ((""[ls->current + 1] & 3) != 0);
      pTVar4 = luaX_newstring(ls,ls->buff->buffer,ls->buff->n);
      seminfo->ts = pTVar4;
      if ((pTVar4->tt == '\x04') && (pTVar4->extra != '\0')) {
        return pTVar4->extra + 0xff;
      }
      return 0x123;
    case 9:
    case 0xb:
    case 0xc:
    case 0x20:
      sVar3 = ls->z->n;
      ls->z->n = sVar3 - 1;
      if (sVar3 == 0) {
        local_4c = luaZ_fill(ls->z);
      }
      else {
        pbVar1 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar1 + 1);
        local_4c = (uint)*pbVar1;
      }
      ls->current = local_4c;
      break;
    case 10:
    case 0xd:
      inclinenumber(ls);
      break;
    case 0x22:
    case 0x27:
      read_string(ls,ls->current,seminfo);
      return 0x124;
    case 0x2d:
      sVar3 = ls->z->n;
      ls->z->n = sVar3 - 1;
      if (sVar3 == 0) {
        local_50 = luaZ_fill(ls->z);
      }
      else {
        pbVar1 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar1 + 1);
        local_50 = (uint)*pbVar1;
      }
      ls->current = local_50;
      if (ls->current != 0x2d) {
        return 0x2d;
      }
      sVar3 = ls->z->n;
      ls->z->n = sVar3 - 1;
      if (sVar3 == 0) {
        local_54 = luaZ_fill(ls->z);
      }
      else {
        pbVar1 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar1 + 1);
        local_54 = (uint)*pbVar1;
      }
      ls->current = local_54;
      if (ls->current == 0x5b) {
        sVar3 = skip_sep(ls);
        ls->buff->n = 0;
        if (sVar3 < 2) goto LAB_001a1396;
        read_long_string(ls,(SemInfo *)0x0,sVar3);
        ls->buff->n = 0;
      }
      else {
LAB_001a1396:
        while( true ) {
          bVar5 = false;
          if ((ls->current != 10) && (bVar5 = false, ls->current != 0xd)) {
            bVar5 = ls->current != -1;
          }
          if (!bVar5) break;
          sVar3 = ls->z->n;
          ls->z->n = sVar3 - 1;
          if (sVar3 == 0) {
            local_5c = luaZ_fill(ls->z);
          }
          else {
            pbVar1 = (byte *)ls->z->p;
            ls->z->p = (char *)(pbVar1 + 1);
            local_5c = (uint)*pbVar1;
          }
          ls->current = local_5c;
        }
      }
      break;
    case 0x2e:
      save(ls,ls->current);
      sVar3 = ls->z->n;
      ls->z->n = sVar3 - 1;
      if (sVar3 == 0) {
        local_78 = luaZ_fill(ls->z);
      }
      else {
        pbVar1 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar1 + 1);
        local_78 = (uint)*pbVar1;
      }
      ls->current = local_78;
      iVar2 = check_next1(ls,0x2e);
      if (iVar2 != 0) {
        iVar2 = check_next1(ls,0x2e);
        if (iVar2 != 0) {
          return 0x118;
        }
        return 0x117;
      }
      if ((""[ls->current + 1] & 2) == 0) {
        return 0x2e;
      }
      iVar2 = read_numeral(ls,seminfo);
      return iVar2;
    case 0x2f:
      sVar3 = ls->z->n;
      ls->z->n = sVar3 - 1;
      if (sVar3 == 0) {
        local_6c = luaZ_fill(ls->z);
      }
      else {
        pbVar1 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar1 + 1);
        local_6c = (uint)*pbVar1;
      }
      ls->current = local_6c;
      iVar2 = check_next1(ls,0x2f);
      if (iVar2 != 0) {
        return 0x116;
      }
      return 0x2f;
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      iVar2 = read_numeral(ls,seminfo);
      return iVar2;
    case 0x3a:
      sVar3 = ls->z->n;
      ls->z->n = sVar3 - 1;
      if (sVar3 == 0) {
        local_74 = luaZ_fill(ls->z);
      }
      else {
        pbVar1 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar1 + 1);
        local_74 = (uint)*pbVar1;
      }
      ls->current = local_74;
      iVar2 = check_next1(ls,0x3a);
      if (iVar2 != 0) {
        return 0x11f;
      }
      return 0x3a;
    case 0x3c:
      sVar3 = ls->z->n;
      ls->z->n = sVar3 - 1;
      if (sVar3 == 0) {
        local_64 = luaZ_fill(ls->z);
      }
      else {
        pbVar1 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar1 + 1);
        local_64 = (uint)*pbVar1;
      }
      ls->current = local_64;
      iVar2 = check_next1(ls,0x3d);
      if (iVar2 != 0) {
        return 0x11b;
      }
      iVar2 = check_next1(ls,0x3c);
      if (iVar2 != 0) {
        return 0x11d;
      }
      return 0x3c;
    case 0x3d:
      sVar3 = ls->z->n;
      ls->z->n = sVar3 - 1;
      if (sVar3 == 0) {
        local_60 = luaZ_fill(ls->z);
      }
      else {
        pbVar1 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar1 + 1);
        local_60 = (uint)*pbVar1;
      }
      ls->current = local_60;
      iVar2 = check_next1(ls,0x3d);
      if (iVar2 != 0) {
        return 0x119;
      }
      return 0x3d;
    case 0x3e:
      sVar3 = ls->z->n;
      ls->z->n = sVar3 - 1;
      if (sVar3 == 0) {
        local_68 = luaZ_fill(ls->z);
      }
      else {
        pbVar1 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar1 + 1);
        local_68 = (uint)*pbVar1;
      }
      ls->current = local_68;
      iVar2 = check_next1(ls,0x3d);
      if (iVar2 != 0) {
        return 0x11a;
      }
      iVar2 = check_next1(ls,0x3e);
      if (iVar2 != 0) {
        return 0x11e;
      }
      return 0x3e;
    case 0x5b:
      sVar3 = skip_sep(ls);
      if (1 < sVar3) {
        read_long_string(ls,seminfo,sVar3);
        return 0x124;
      }
      if (sVar3 != 0) {
        return 0x5b;
      }
      lexerror(ls,"invalid long string delimiter",0x124);
    case 0x7e:
      sVar3 = ls->z->n;
      ls->z->n = sVar3 - 1;
      if (sVar3 == 0) {
        local_70 = luaZ_fill(ls->z);
      }
      else {
        pbVar1 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar1 + 1);
        local_70 = (uint)*pbVar1;
      }
      ls->current = local_70;
      iVar2 = check_next1(ls,0x3d);
      if (iVar2 != 0) {
        return 0x11c;
      }
      return 0x7e;
    case -1:
      return 0x120;
    }
  } while( true );
}

Assistant:

static int llex (LexState *ls, SemInfo *seminfo) {
  luaZ_resetbuffer(ls->buff);
  for (;;) {
    switch (ls->current) {
      case '\n': case '\r': {  /* line breaks */
        inclinenumber(ls);
        break;
      }
      case ' ': case '\f': case '\t': case '\v': {  /* spaces */
        next(ls);
        break;
      }
      case '-': {  /* '-' or '--' (comment) */
        next(ls);
        if (ls->current != '-') return '-';
        /* else is a comment */
        next(ls);
        if (ls->current == '[') {  /* long comment? */
          size_t sep = skip_sep(ls);
          luaZ_resetbuffer(ls->buff);  /* 'skip_sep' may dirty the buffer */
          if (sep >= 2) {
            read_long_string(ls, NULL, sep);  /* skip long comment */
            luaZ_resetbuffer(ls->buff);  /* previous call may dirty the buff. */
            break;
          }
        }
        /* else short comment */
        while (!currIsNewline(ls) && ls->current != EOZ)
          next(ls);  /* skip until end of line (or end of file) */
        break;
      }
      case '[': {  /* long string or simply '[' */
        size_t sep = skip_sep(ls);
        if (sep >= 2) {
          read_long_string(ls, seminfo, sep);
          return TK_STRING;
        }
        else if (sep == 0)  /* '[=...' missing second bracket? */
          lexerror(ls, "invalid long string delimiter", TK_STRING);
        return '[';
      }
      case '=': {
        next(ls);
        if (check_next1(ls, '=')) return TK_EQ;  /* '==' */
        else return '=';
      }
      case '<': {
        next(ls);
        if (check_next1(ls, '=')) return TK_LE;  /* '<=' */
        else if (check_next1(ls, '<')) return TK_SHL;  /* '<<' */
        else return '<';
      }
      case '>': {
        next(ls);
        if (check_next1(ls, '=')) return TK_GE;  /* '>=' */
        else if (check_next1(ls, '>')) return TK_SHR;  /* '>>' */
        else return '>';
      }
      case '/': {
        next(ls);
        if (check_next1(ls, '/')) return TK_IDIV;  /* '//' */
        else return '/';
      }
      case '~': {
        next(ls);
        if (check_next1(ls, '=')) return TK_NE;  /* '~=' */
        else return '~';
      }
      case ':': {
        next(ls);
        if (check_next1(ls, ':')) return TK_DBCOLON;  /* '::' */
        else return ':';
      }
      case '"': case '\'': {  /* short literal strings */
        read_string(ls, ls->current, seminfo);
        return TK_STRING;
      }
      case '.': {  /* '.', '..', '...', or number */
        save_and_next(ls);
        if (check_next1(ls, '.')) {
          if (check_next1(ls, '.'))
            return TK_DOTS;   /* '...' */
          else return TK_CONCAT;   /* '..' */
        }
        else if (!lisdigit(ls->current)) return '.';
        else return read_numeral(ls, seminfo);
      }
      case '0': case '1': case '2': case '3': case '4':
      case '5': case '6': case '7': case '8': case '9': {
        return read_numeral(ls, seminfo);
      }
      case EOZ: {
        return TK_EOS;
      }
      default: {
        if (lislalpha(ls->current)) {  /* identifier or reserved word? */
          TString *ts;
          do {
            save_and_next(ls);
          } while (lislalnum(ls->current));
          ts = luaX_newstring(ls, luaZ_buffer(ls->buff),
                                  luaZ_bufflen(ls->buff));
          seminfo->ts = ts;
          if (isreserved(ts))  /* reserved word? */
            return ts->extra - 1 + FIRST_RESERVED;
          else {
            return TK_NAME;
          }
        }
        else {  /* single-char tokens ('+', '*', '%', '{', '}', ...) */
          int c = ls->current;
          next(ls);
          return c;
        }
      }
    }
  }
}